

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O2

void __thiscall
matrix_sparse_row_test_at_Test::~matrix_sparse_row_test_at_Test
          (matrix_sparse_row_test_at_Test *this)

{
  matrix_sparse_row_test::~matrix_sparse_row_test(&this->super_matrix_sparse_row_test);
  operator_delete(this,0x60);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, at) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  EXPECT_DOUBLE_EQ(row.at(1), 3.0);
  EXPECT_DOUBLE_EQ(row.at(3), 4.0);
  EXPECT_DOUBLE_EQ(row.at(4), 5.0);

  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), "./*");
  EXPECT_DEATH(remove_warning = row.at(2), "./*");
  EXPECT_DEATH(remove_warning = row.at(5), "./*");
}